

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int calc_cookie_signature
              (ptls_t *tls,ptls_handshake_properties_t *properties,
              ptls_key_exchange_algorithm_t *negotiated_group,ptls_iovec_t tbs,uint8_t *sig)

{
  ushort uVar1;
  ptls_hash_algorithm_t *algo;
  ulong uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  ptls_hash_context_t *ppVar5;
  size_t sVar6;
  int iVar7;
  uint16_t uVar8;
  uint8_t len8_3;
  uint8_t len8_2;
  uint8_t len8_1;
  uint8_t len8;
  uint8_t b_1 [2];
  uint8_t b [2];
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  ushort local_4c;
  ushort local_4a;
  uint8_t *local_48;
  size_t local_40;
  uint8_t *local_38;
  
  local_38 = tbs.base;
  algo = (*tls->ctx->cipher_suites)->hash;
  ppVar5 = ptls_hmac_create(algo,(properties->field_0).server.cookie.key,algo->digest_size);
  if (ppVar5 == (ptls_hash_context_t *)0x0) {
    iVar7 = 0x201;
  }
  else {
    local_4d = 0x20;
    local_48 = sig;
    local_40 = tbs.len;
    (*ppVar5->update)(ppVar5,&local_4d,1);
    (*ppVar5->update)(ppVar5,tls->client_random,0x20);
    uVar8 = 0;
    if (tls->server_name == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = strlen(tls->server_name);
      if (0xfe < sVar6) {
        __assert_fail("len < UINT8_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x10af,
                      "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                     );
      }
    }
    local_4e = (undefined1)sVar6;
    (*ppVar5->update)(ppVar5,&local_4e,1);
    (*ppVar5->update)(ppVar5,tls->server_name,sVar6);
    uVar1 = tls->cipher_suite->id;
    local_4a = uVar1 << 8 | uVar1 >> 8;
    (*ppVar5->update)(ppVar5,&local_4a,2);
    if (negotiated_group != (ptls_key_exchange_algorithm_t *)0x0) {
      uVar8 = negotiated_group->id;
    }
    local_4c = uVar8 << 8 | uVar8 >> 8;
    (*ppVar5->update)(ppVar5,&local_4c,2);
    sVar4 = local_40;
    uVar2 = (properties->field_0).server.cookie.additional_data.len;
    if (0xfe < uVar2) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x10b2,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_4f = (undefined1)uVar2;
    (*ppVar5->update)(ppVar5,&local_4f,1);
    (*ppVar5->update)(ppVar5,(properties->field_0).server.cookie.additional_data.base,uVar2);
    puVar3 = local_48;
    if (0xfe < sVar4) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x10b4,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_50 = (undefined1)sVar4;
    (*ppVar5->update)(ppVar5,&local_50,1);
    (*ppVar5->update)(ppVar5,local_38,sVar4);
    iVar7 = 0;
    (*ppVar5->final)(ppVar5,puVar3,PTLS_HASH_FINAL_MODE_FREE);
  }
  return iVar7;
}

Assistant:

static int calc_cookie_signature(ptls_t *tls, ptls_handshake_properties_t *properties,
                                 ptls_key_exchange_algorithm_t *negotiated_group, ptls_iovec_t tbs, uint8_t *sig)
{
    ptls_hash_algorithm_t *algo = tls->ctx->cipher_suites[0]->hash;
    ptls_hash_context_t *hctx;

    if ((hctx = ptls_hmac_create(algo, properties->server.cookie.key, algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

#define UPDATE_BLOCK(p, _len)                                                                                                      \
    do {                                                                                                                           \
        size_t len = (_len);                                                                                                       \
        assert(len < UINT8_MAX);                                                                                                   \
        uint8_t len8 = (uint8_t)len;                                                                                               \
        hctx->update(hctx, &len8, 1);                                                                                              \
        hctx->update(hctx, (p), len);                                                                                              \
    } while (0)
#define UPDATE16(_v)                                                                                                               \
    do {                                                                                                                           \
        uint16_t v = (_v);                                                                                                         \
        uint8_t b[2] = {v >> 8, v & 0xff};                                                                                         \
        hctx->update(hctx, b, 2);                                                                                                  \
    } while (0)

    UPDATE_BLOCK(tls->client_random, sizeof(tls->client_random));
    UPDATE_BLOCK(tls->server_name, tls->server_name != NULL ? strlen(tls->server_name) : 0);
    UPDATE16(tls->cipher_suite->id);
    UPDATE16(negotiated_group != NULL ? negotiated_group->id : 0);
    UPDATE_BLOCK(properties->server.cookie.additional_data.base, properties->server.cookie.additional_data.len);

    UPDATE_BLOCK(tbs.base, tbs.len);

#undef UPDATE_BLOCK
#undef UPDATE16

    hctx->final(hctx, sig, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}